

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# natwm.c
# Opt level: O3

int main(int argc,char **argv)

{
  sigset_t *__set;
  int iVar1;
  natwm_error nVar2;
  undefined8 *__ptr;
  undefined4 extraout_var;
  natwm_state *state;
  map *pmVar3;
  xcb_connection_t *pxVar4;
  undefined8 uVar5;
  xcb_ewmh_connection_t *pxVar6;
  button_state *pbVar7;
  theme *ptVar8;
  char *pcVar9;
  char *__s;
  char *__s_00;
  undefined1 local_f0 [136];
  int local_68;
  void *local_58;
  void *wm_events_result;
  pthread_t wm_events_thread;
  char *local_40;
  int local_34 [2];
  int screen_num;
  
  local_34[0] = 0;
  __ptr = (undefined8 *)malloc(0x18);
  if (__ptr == (undefined8 *)0x0) {
LAB_00103dc9:
    main_cold_2();
LAB_00103dce:
    internal_logger(natwm_logger,LEVEL_CRITICAL,"Failed to initialize applicaiton state");
    exit(1);
  }
  *__ptr = 0;
  __ptr[1] = 0;
  *(undefined1 *)(__ptr + 2) = 0;
  _opterr = 0;
  local_40 = (char *)0x0;
  wm_events_thread = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        iVar1 = getopt(argc,argv,"c:hs:vV");
        if (iVar1 != 0x73) break;
        __ptr[1] = _optarg;
      }
      if (0x62 < iVar1) break;
      if (iVar1 == -1) {
        initialize_logger((_Bool)((byte)wm_events_thread & 1));
        state = natwm_state_create();
        if (state == (natwm_state *)0x0) goto LAB_00103dce;
        state->screen_num = 0;
        if (local_40 == (char *)0x0) {
          pcVar9 = state->config_path;
        }
        else {
          state->config_path = local_40;
          pcVar9 = local_40;
        }
        pmVar3 = config_initialize_path(pcVar9);
        state->config = pmVar3;
        if (pmVar3 == (map *)0x0) goto LAB_00103ba9;
        __set = (sigset_t *)(local_f0 + 8);
        local_f0._0_8_ = signal_handler;
        sigemptyset(__set);
        sigaddset(__set,0xf);
        sigaddset(__set,2);
        sigaddset(__set,1);
        local_68 = 0x10000000;
        iVar1 = sigaction(0xf,(sigaction *)local_f0,(sigaction *)0x0);
        if (((iVar1 == -1) ||
            (iVar1 = sigaction(2,(sigaction *)local_f0,(sigaction *)0x0), iVar1 == -1)) ||
           (iVar1 = sigaction(1,(sigaction *)local_f0,(sigaction *)0x0), iVar1 == -1)) {
          internal_logger(natwm_logger,LEVEL_ERROR,
                          "Failed to handle signals - This may cause problems!");
        }
        pxVar4 = (xcb_connection_t *)xcb_connect(__ptr[1],local_34);
        iVar1 = xcb_connection_has_error(pxVar4);
        if (iVar1 < 1) {
          state->xcb = pxVar4;
          if (pxVar4 == (xcb_connection_t *)0x0) goto LAB_00103ba9;
          internal_logger(natwm_logger,LEVEL_INFO,"Successfully connected to X server");
          iVar1 = local_34[0];
          uVar5 = xcb_get_setup(state->xcb);
          local_f0._0_16_ = xcb_setup_roots_iterator(uVar5);
          if (local_f0._8_4_ == 0) goto LAB_00103b5b;
          iVar1 = iVar1 + 1;
          goto LAB_00103b41;
        }
        if (iVar1 - 2U < 5) {
          pcVar9 = &DAT_0010c488 + *(int *)(&DAT_0010c488 + (ulong)(iVar1 - 2U) * 4);
        }
        else {
          pcVar9 = "Connection to the X server failed";
        }
        internal_logger(natwm_logger,LEVEL_CRITICAL,pcVar9);
        xcb_disconnect(pxVar4);
        state->xcb = (xcb_connection_t *)0x0;
        goto LAB_00103ba9;
      }
      if (iVar1 != 0x56) goto LAB_00103dc1;
      *(undefined1 *)(__ptr + 2) = 1;
      wm_events_thread = CONCAT71((int7)(CONCAT44(extraout_var,iVar1) >> 8),1);
    }
    if (iVar1 != 99) break;
    local_40 = _optarg;
    *__ptr = _optarg;
  }
  if (iVar1 == 0x68) {
    puts("natwm v0.0.1");
    puts("-c <file>, Set the config file");
    puts("-h,        Print this help message");
    __s = "-V,        Verbose mode";
    __s_00 = "-v,        Print version information";
    pcVar9 = "-s,        Specify specific screen for X";
  }
  else {
    if (iVar1 != 0x76) {
LAB_00103dc1:
      main_cold_1();
      goto LAB_00103dc9;
    }
    __s = "Released under the Revised BSD License";
    __s_00 = "Copywrite (c) 2020 Chris Frank";
    pcVar9 = "natwm v0.0.1";
  }
  puts(pcVar9);
  puts(__s_00);
  puts(__s);
  free(__ptr);
  exit(0);
LAB_00103b41:
  iVar1 = iVar1 + -1;
  if (iVar1 == 0) {
    state->screen = (xcb_screen_t *)local_f0._0_8_;
    if ((xcb_screen_t *)local_f0._0_8_ == (xcb_screen_t *)0x0) goto LAB_00103b63;
    nVar2 = event_subscribe_to_root(state);
    if (nVar2 != NO_ERROR) {
      pcVar9 = "Failed to subscribe to root events: Other window manager is present";
      goto LAB_00103b6e;
    }
    pxVar6 = ewmh_create(state->xcb);
    state->ewmh = pxVar6;
    if (pxVar6 != (xcb_ewmh_connection_t *)0x0) {
      ewmh_init(state);
      pbVar7 = button_state_create(state->xcb);
      state->button_state = pbVar7;
      if (pbVar7 == (button_state *)0x0) {
        pcVar9 = "Failed to initialize button state";
        goto LAB_00103b6e;
      }
      nVar2 = monitor_setup(state,&state->monitor_list);
      if (nVar2 == NO_ERROR) {
        nVar2 = workspace_list_init(state,&state->workspace_list);
        if (nVar2 != NO_ERROR) {
          pcVar9 = "Failed to setup workspaces";
          goto LAB_00103b6e;
        }
        ptVar8 = theme_create(state->config);
        state->workspace_list->theme = ptVar8;
        if (state->workspace_list->theme != (theme *)0x0) {
          status = 0;
          local_58 = (void *)0x0;
          iVar1 = 0;
          pthread_create((pthread_t *)&wm_events_result,(pthread_attr_t *)0x0,wm_event_loop,state);
          pthread_join((pthread_t)wm_events_result,&local_58);
          if (local_58 == (void *)0x0) goto LAB_00103bcc;
          goto LAB_00103ba9;
        }
        pcVar9 = "Failed to initialize client theme";
        goto LAB_00103b6e;
      }
    }
    pcVar9 = "Failed to setup monitor";
    goto LAB_00103b6e;
  }
  xcb_screen_next(local_f0);
  if (local_f0._8_4_ == 0) {
LAB_00103b5b:
    state->screen = (xcb_screen_t *)0x0;
LAB_00103b63:
    pcVar9 = "Failed to find default screen";
LAB_00103b6e:
    internal_logger(natwm_logger,LEVEL_ERROR,pcVar9);
LAB_00103ba9:
    internal_logger(natwm_logger,LEVEL_CRITICAL,"Encountered error. Closing...");
    iVar1 = 1;
LAB_00103bcc:
    free(__ptr);
    natwm_state_destroy(state);
    destroy_logger(natwm_logger);
    return iVar1;
  }
  goto LAB_00103b41;
}

Assistant:

int main(int argc, char **argv)
{
        int screen_num = 0;
        struct argument_options *arg_options = parse_arguments(argc, argv);

        if (arg_options == NULL) {
                fprintf(stderr, "Failed to parse command line arguments");

                exit(EXIT_FAILURE);
        }

        // Initialize the logger
        initialize_logger(arg_options->verbose);

        // Initialize program state
        struct natwm_state *state = natwm_state_create();

        if (state == NULL) {
                LOG_CRITICAL(natwm_logger, "Failed to initialize applicaiton state");

                exit(EXIT_FAILURE);
        }

        state->screen_num = screen_num;

        // Initialize config
        if (arg_options->config_path) {
                state->config_path = arg_options->config_path;
        }

        state->config = config_initialize_path(state->config_path);

        if (state->config == NULL) {
                goto free_and_error;
        }

        // Catch and handle signals
        if (install_signal_handlers() != 0) {
                LOG_ERROR(natwm_logger, "Failed to handle signals - This may cause problems!");
        }

        // Initialize x
        state->xcb = make_connection(arg_options->screen, &screen_num);

        if (state->xcb == NULL) {
                goto free_and_error;
        }

        LOG_INFO(natwm_logger, "Successfully connected to X server");

        // Find the default screen
        state->screen = find_default_screen(state->xcb, screen_num);

        if (state->screen == NULL) {
                LOG_ERROR(natwm_logger, "Failed to find default screen");

                goto free_and_error;
        }

        // Attempt to register for substructure events
        if (event_subscribe_to_root(state) != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to subscribe to root events: Other window "
                          "manager is present");

                goto free_and_error;
        }

        state->ewmh = ewmh_create(state->xcb);

        if (state->ewmh == NULL) {
                LOG_ERROR(natwm_logger, "Failed to setup monitor");

                goto free_and_error;
        }

        // Initialize ewmh hinting
        ewmh_init(state);

        state->button_state = button_state_create(state->xcb);

        if (state->button_state == NULL) {
                LOG_ERROR(natwm_logger, "Failed to initialize button state");

                goto free_and_error;
        }

        if (monitor_setup(state, &state->monitor_list) != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to setup monitor");

                goto free_and_error;
        }

        if (workspace_list_init(state, &state->workspace_list) != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Failed to setup workspaces");

                goto free_and_error;
        }

        // Before we can start registering clients we need to load the theme
        // from the configuration file. This will save us trips to the config
        // map when registering clients.
        //
        // TODO: Set defaults so we don't have a hard requirement on the user
        // settings these in their configuration
        state->workspace_list->theme = theme_create(state->config);

        if (state->workspace_list->theme == NULL) {
                LOG_ERROR(natwm_logger, "Failed to initialize client theme");

                goto free_and_error;
        }

        status = RUNNING;

        // Start wm thread
        void *wm_events_result = NULL;
        pthread_t wm_events_thread;

        pthread_create(&wm_events_thread, NULL, wm_event_loop, state);
        pthread_join(wm_events_thread, &wm_events_result);

        if ((intptr_t)wm_events_result != 0) {
                goto free_and_error;
        }

        free(arg_options);
        natwm_state_destroy(state);
        destroy_logger(natwm_logger);

        return EXIT_SUCCESS;

free_and_error:
        LOG_CRITICAL(natwm_logger, "Encountered error. Closing...");

        free(arg_options);
        natwm_state_destroy(state);
        destroy_logger(natwm_logger);

        return EXIT_FAILURE;
}